

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getAttributeData
          (LineRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  pointer pVVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  vector<int,_std::allocator<int>_> local_38;
  deRandom local_20;
  
  iVar4 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(long)(iVar4 * iVar4 * 2),(allocator_type *)&local_20);
  deRandom_init(&local_20,0xde12345);
  uVar2 = (uint)((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = (int)uVar6;
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar6);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_20,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (0 < (int)((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      uVar2 = *(uint *)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7);
      iVar4 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
      lVar1 = CONCAT44((int)uVar2 >> 0x1f,(int)uVar2 >> 1);
      iVar5 = (int)lVar7;
      pVVar8 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar5;
      fVar11 = (float)iVar4;
      iVar3 = (int)(lVar1 / (long)iVar4);
      fVar10 = (float)(int)(lVar1 % (long)iVar4);
      if ((uVar2 & 1) == 0) {
        pVVar8->m_data[0] = (float)iVar3 / fVar11;
        pVVar8->m_data[1] = fVar10 / fVar11;
        pVVar8->m_data[2] = 0.0;
        pVVar8->m_data[3] = 1.0;
        pVVar8 = (data->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (iVar5 + 1);
        pVVar8->m_data[0] = 0.0;
        pVVar8->m_data[1] = 0.0;
        pVVar8->m_data[2] = 1.0;
        pVVar8->m_data[3] = 1.0;
        fVar12 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
        fVar11 = (float)(iVar3 + 1) / fVar12;
        fVar10 = fVar10 / fVar12;
        fVar12 = 0.0;
        fVar13 = 1.0;
      }
      else {
        pVVar8->m_data[0] = fVar10 / fVar11;
        pVVar8->m_data[1] = (float)iVar3 / fVar11;
        pVVar8->m_data[2] = 0.0;
        pVVar8->m_data[3] = 1.0;
        pVVar8 = (data->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (iVar5 + 1);
        pVVar8->m_data[0] = 0.0;
        pVVar8->m_data[1] = 1.0;
        pVVar8->m_data[2] = 0.0;
        pVVar8->m_data[3] = 1.0;
        fVar12 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
        fVar11 = fVar10 / fVar12;
        fVar10 = (float)(iVar3 + 1) / fVar12;
        fVar13 = 0.0;
        fVar12 = 1.0;
      }
      iVar4 = iVar5 + 2;
      pVVar8 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar8[iVar4].m_data[0] = fVar11;
      pVVar8[iVar4].m_data[1] = fVar10;
      pVVar8[iVar4].m_data[2] = 0.0;
      pVVar8[iVar4].m_data[3] = 1.0;
      iVar5 = iVar5 + 3;
      pVVar8 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar8[iVar5].m_data[0] = 0.0;
      pVVar8[iVar5].m_data[1] = fVar12;
      pVVar8[iVar5].m_data[2] = fVar13;
      pVVar8[iVar5].m_data[3] = 1.0;
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar9 < (int)((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LineRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		blue		(0.0f, 0.0f, 1.0f, 1.0f);
	std::vector<int>	cellOrder	(m_patternSide * m_patternSide * 2);
	de::Random			rnd			(0xDE12345);

	// generate crosshatch pattern with segments in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(cellOrder.size() * 4);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int segmentID		= cellOrder[ndx];
		const int direction		= segmentID & 0x01;
		const int majorCoord	= (segmentID >> 1) / m_patternSide;
		const int minorCoord	= (segmentID >> 1) % m_patternSide;

		if (direction)
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord + 1) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
		}
		else
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord + 1) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
		}
	}
}